

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int inferred_mb_field_decoding_flag(h264_slice *slice)

{
  h264_macroblock *phVar1;
  h264_macroblock *phVar2;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_slice *slice_local;
  
  if (slice->mbaff_frame_flag == 0) {
    slice_local._4_4_ = slice->field_pic_flag;
  }
  else {
    phVar1 = h264_mb_nb_p(slice,H264_MB_A,0);
    phVar2 = h264_mb_nb_p(slice,H264_MB_B,0);
    if (phVar1->mb_type == 0x39) {
      if (phVar2->mb_type == 0x39) {
        slice_local._4_4_ = 0;
      }
      else {
        slice_local._4_4_ = phVar2->mb_field_decoding_flag;
      }
    }
    else {
      slice_local._4_4_ = phVar1->mb_field_decoding_flag;
    }
  }
  return slice_local._4_4_;
}

Assistant:

static int inferred_mb_field_decoding_flag(struct h264_slice *slice) {
	if (slice->mbaff_frame_flag) {
		const struct h264_macroblock *mbA = h264_mb_nb_p(slice, H264_MB_A, 0);
		const struct h264_macroblock *mbB = h264_mb_nb_p(slice, H264_MB_B, 0);
		if (mbA->mb_type != H264_MB_TYPE_UNAVAIL) {
			return mbA->mb_field_decoding_flag;
		} else if (mbB->mb_type != H264_MB_TYPE_UNAVAIL) {
			return mbB->mb_field_decoding_flag;
		} else {
			return 0;
		}
	} else {
		return slice->field_pic_flag;
	}
}